

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# java_message_field_lite.cc
# Opt level: O2

void __thiscall
google::protobuf::compiler::java::RepeatedImmutableMessageFieldLiteGenerator::GenerateFieldInfo
          (RepeatedImmutableMessageFieldLiteGenerator *this,Printer *printer,
          vector<unsigned_short,_std::allocator<unsigned_short>_> *output)

{
  uint32_t number;
  
  WriteUInt32ToUtf16CharSequence(*(uint32_t *)(this->descriptor_ + 4),output);
  number = GetExperimentalJavaFieldType(this->descriptor_);
  WriteUInt32ToUtf16CharSequence(number,output);
  io::Printer::Print(printer,&this->variables_,"\"$name$_\",\n$type$.class,\n");
  return;
}

Assistant:

void RepeatedImmutableMessageFieldLiteGenerator::GenerateFieldInfo(
    io::Printer* printer, std::vector<uint16_t>* output) const {
  WriteIntToUtf16CharSequence(descriptor_->number(), output);
  WriteIntToUtf16CharSequence(GetExperimentalJavaFieldType(descriptor_),
                              output);
  printer->Print(variables_,
                 "\"$name$_\",\n"
                 "$type$.class,\n");
}